

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O0

void triphone_add(mdef_t *m,s3cipid_t ci,s3cipid_t lc,s3cipid_t rc,word_posn_t wpos,s3pid_t p)

{
  ph_rc_t *ppVar1;
  ph_rc_s *ppVar2;
  char local_1038 [8];
  char buf [4096];
  ph_rc_t *rcptr;
  ph_lc_t *lcptr;
  s3pid_t p_local;
  word_posn_t wpos_local;
  s3cipid_t rc_local;
  s3cipid_t lc_local;
  s3cipid_t ci_local;
  mdef_t *m_local;
  
  if (m->n_phone <= p) {
    __assert_fail("p < m->n_phone",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                  ,0xd2,
                  "void triphone_add(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t, s3pid_t)"
                 );
  }
  m->phone[p].ci = ci;
  m->phone[p].lc = lc;
  m->phone[p].rc = rc;
  m->phone[p].wpos = wpos;
  if (m->n_ciphone <= p) {
    rcptr = (ph_rc_t *)find_ph_lc(m->wpos_ci_lclist[wpos][(int)ci],lc);
    if ((ph_lc_t *)rcptr == (ph_lc_t *)0x0) {
      rcptr = (ph_rc_t *)
              __ckd_calloc__(1,0x18,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                             ,0xde);
      ((ph_lc_t *)rcptr)->lc = lc;
      ((ph_lc_t *)rcptr)->next = m->wpos_ci_lclist[wpos][(int)ci];
      m->wpos_ci_lclist[wpos][(int)ci] = (ph_lc_t *)rcptr;
    }
    ppVar1 = find_ph_rc(rcptr->next,rc);
    if (ppVar1 != (ph_rc_t *)0x0) {
      mdef_phone_str(m,ppVar1->pid,local_1038);
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,0xe7,"Duplicate triphone: %s\n",local_1038);
      exit(1);
    }
    ppVar2 = (ph_rc_s *)
             __ckd_calloc__(1,0x10,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                            ,0xea);
    ppVar2->rc = rc;
    ppVar2->pid = p;
    ppVar2->next = rcptr->next;
    rcptr->next = ppVar2;
  }
  return;
}

Assistant:

static void
triphone_add(mdef_t * m,
             s3cipid_t ci, s3cipid_t lc, s3cipid_t rc, word_posn_t wpos,
             s3pid_t p)
{
    ph_lc_t *lcptr;
    ph_rc_t *rcptr;

    assert(p < m->n_phone);

    /* Fill in phone[p] information (state and tmat mappings added later) */
    m->phone[p].ci = ci;
    m->phone[p].lc = lc;
    m->phone[p].rc = rc;
    m->phone[p].wpos = wpos;

    /* Create <ci,lc,rc,wpos> -> p mapping if not a CI phone */
    if (p >= m->n_ciphone) {
        if ((lcptr = find_ph_lc(m->wpos_ci_lclist[wpos][(int) ci], lc))
            == NULL) {
            lcptr = (ph_lc_t *) ckd_calloc(1, sizeof(ph_lc_t)); /* freed at mdef_free, I believe */
            lcptr->lc = lc;
            lcptr->next = m->wpos_ci_lclist[wpos][(int) ci];
            m->wpos_ci_lclist[wpos][(int) ci] = lcptr;  /* This is what needs to be freed */
        }
        if ((rcptr = find_ph_rc(lcptr->rclist, rc)) != NULL) {
            char buf[4096];

            mdef_phone_str(m, rcptr->pid, buf);
            E_FATAL("Duplicate triphone: %s\n", buf);
        }

        rcptr = (ph_rc_t *) ckd_calloc(1, sizeof(ph_rc_t));     /* freed in mdef_free, I believe */
        rcptr->rc = rc;
        rcptr->pid = p;
        rcptr->next = lcptr->rclist;
        lcptr->rclist = rcptr;
    }
}